

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_RotateZ(double (*input) [3],double degrees,double (*result) [3])

{
  double in_XMM0_Qa;
  double radians;
  double cosvalue;
  double sinvalue;
  double transformationmatrix [3] [3];
  double (*in_stack_ffffffffffffffd0) [3];
  double (*in_stack_ffffffffffffffd8) [3];
  double (*in_stack_ffffffffffffffe0) [3];
  
  M3x3_LoadIdentity((double (*) [3])0x107744);
  cos(in_XMM0_Qa * 0.017453292519943295);
  sin(in_XMM0_Qa * 0.017453292519943295);
  M3x3_MulMatrix(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void M3x3_RotateZ(double input[][3], double degrees, double result[3][3])
{
    double transformationmatrix[3][3];
    double sinvalue, cosvalue, radians;

    M3x3_LoadIdentity(transformationmatrix);

    radians = degrees * (M_PI/180.0);
    cosvalue = cos(radians);
    sinvalue = sin(radians);

    transformationmatrix[0][0] =  cosvalue;
    transformationmatrix[0][1] = -sinvalue;
    transformationmatrix[1][0] =  sinvalue;
    transformationmatrix[1][1] =  cosvalue;

    M3x3_MulMatrix(transformationmatrix, input, result);
}